

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O0

void __thiscall
gui::MultilineTextBox::handleMousePress(MultilineTextBox *this,Button button,Vector2f *mouseParent)

{
  Widget *in_RDX;
  int in_ESI;
  Vector2<float> *in_RDI;
  undefined4 unaff_retaddr;
  Button unaff_retaddr_00;
  Vector2f mouseLocal;
  Vector2f *in_stack_00000208;
  MultilineTextBox *in_stack_00000210;
  Vector2f *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  Widget::handleMousePress
            ((Widget *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(Button)((ulong)in_RDX >> 0x20),
             in_stack_ffffffffffffffe0);
  Widget::toLocalOriginSpace(in_RDX,in_stack_ffffffffffffffe0);
  if (in_ESI == 0) {
    findClosestOffsetToMouse(in_stack_00000210,in_stack_00000208);
    updateCaretPosition((MultilineTextBox *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(size_t)in_RDI,
                        SUB41((uint)in_ESI >> 0x18,0));
  }
  if (in_ESI < 3) {
    Signal<gui::Widget_*,_const_sf::Vector2<float>_&>::emit
              ((Signal<gui::Widget_*,_const_sf::Vector2<float>_&> *)mouseParent,(Widget *)mouseLocal
               ,(Vector2<float> *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  }
  Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>::emit
            ((Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&> *)mouseParent,
             (Widget *)mouseLocal,unaff_retaddr_00,in_RDI);
  return;
}

Assistant:

void MultilineTextBox::handleMousePress(sf::Mouse::Button button, const sf::Vector2f& mouseParent) {
    baseClass::handleMousePress(button, mouseParent);
    const auto mouseLocal = toLocalOriginSpace(mouseParent);
    if (button == sf::Mouse::Left) {
        updateCaretPosition(findClosestOffsetToMouse(mouseLocal), false);
    }
    if (button <= sf::Mouse::Middle) {
        onClick.emit(this, mouseLocal);
    }
    onMousePress.emit(this, button, mouseLocal);
}